

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcParser.h
# Opt level: O2

void __thiscall Calc::CalcParser::translateUnaryOperation(CalcParser *this,ProductionEnum operation)

{
  pointer pfVar1;
  Number number;
  float fVar2;
  
  pfVar1 = (this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  number = 0.0;
  fVar2 = 0.0;
  if ((this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != pfVar1) {
    fVar2 = pfVar1[-1];
    (this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1 + -1;
  }
  if (operation == Negation) {
    number = -fVar2;
  }
  storeNumber(this,number);
  return;
}

Assistant:

void translateUnaryOperation(ProductionEnum operation) {
        auto const operand = extractNumber();
        auto const result  = evaluate(operation, operand);
        storeNumber(result);
    }